

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::GetHandle<WarehouseServer,bool,Product_const&>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_WarehouseServer_to_subr method,WarehouseServer *instance)

{
  function<bool_(const_Product_&)> *f;
  function<bool_(const_Product_&)> local_90;
  anon_class_24_2_b747b145 local_70;
  undefined1 local_58 [8];
  function<bool_(const_Product_&)> function;
  WarehouseServer *instance_local;
  offset_in_WarehouseServer_to_subr method_local;
  
  local_70.instance = instance;
  local_70.method = (offset_in_WarehouseServer_to_subr)this;
  local_70._16_8_ = method;
  function._M_invoker = (_Invoker_type)instance;
  std::function<bool(Product_const&)>::
  function<jsonrpccxx::GetHandle<WarehouseServer,bool,Product_const&>(bool(WarehouseServer::*)(Product_const&),WarehouseServer&)::_lambda(Product_const&)_1_,void>
            ((function<bool(Product_const&)> *)local_58,&local_70);
  std::function<bool_(const_Product_&)>::function
            (&local_90,(function<bool_(const_Product_&)> *)local_58);
  GetHandle<bool,Product_const&>(__return_storage_ptr__,(jsonrpccxx *)&local_90,f);
  std::function<bool_(const_Product_&)>::~function(&local_90);
  std::function<bool_(const_Product_&)>::~function((function<bool_(const_Product_&)> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (T::*method)(ParamTypes...), T &instance) {
    std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> ReturnType {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return GetHandle(function);
  }